

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_uniform_location(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint32 program_00;
  RenderContext *renderCtx;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  GLuint local_218;
  allocator<char> local_211;
  GLuint notAProgram;
  allocator<char> local_1d9;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLuint shader;
  GLuint programEmpty;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs._4_4_ =
       glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  program.m_program.m_info.linkTimeUs._0_4_ =
       glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,puVar1,&local_1d9);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&notAProgram,puVar1,&local_211);
  glu::makeVtxFragSources(&local_1b8,&local_1d8,(string *)&notAProgram);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&notAProgram);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  local_218 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "GL_INVALID_OPERATION is generated if program has not been successfully linked.",
             &local_239);
  NegativeTestContext::beginSection(ctx,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  glu::CallLogWrapper::glGetUniformLocation
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_,"test");
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_261);
  NegativeTestContext::beginSection(ctx,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glGetUniformLocation(&ctx->super_CallLogWrapper,local_218,"test");
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_289);
  NegativeTestContext::beginSection(ctx,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  glu::CallLogWrapper::glGetAttribLocation
            (&ctx->super_CallLogWrapper,(GLuint)program.m_program.m_info.linkTimeUs,"test");
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_);
  glu::CallLogWrapper::glDeleteShader
            (&ctx->super_CallLogWrapper,(GLuint)program.m_program.m_info.linkTimeUs);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void get_uniform_location (NegativeTestContext& ctx)
{
	GLuint programEmpty = ctx.glCreateProgram();
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_OPERATION is generated if program has not been successfully linked.");
	ctx.glGetUniformLocation(programEmpty, "test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glUseProgram(program.getProgram());
	ctx.glGetUniformLocation(notAProgram, "test");
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetAttribLocation(shader, "test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteProgram(programEmpty);
	ctx.glDeleteShader(shader);
}